

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_exception(XmlReporter *this,TestCaseException *e)

{
  ScopedElement *this_00;
  string *text;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  lock_guard<std::mutex> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_ffffffffffffff28;
  ScopedElement *in_stack_ffffffffffffff30;
  XmlWriter *this_02;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_79 [56];
  allocator<char> local_41 [65];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_02 = (XmlWriter *)&in_RDI->_M_string_length;
  __a = local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  XmlWriter::scopedElement(this_02,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  this_00 = XmlWriter::ScopedElement::writeAttribute<bool>
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (bool *)in_stack_ffffffffffffff20);
  text = (string *)String::c_str((String *)0x123b65);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff5f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__a);
  XmlWriter::ScopedElement::writeText(this_00,text,SUB81((ulong)this_01 >> 0x38,0));
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator(local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator(local_41);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x123c03);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.scopedElement("Exception")
                    .writeAttribute("crash", e.is_crash)
                    .writeText(e.error_string.c_str());
        }